

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_misc.c
# Opt level: O3

void HTS_fclose(HTS_File *fp)

{
  undefined8 *__ptr;
  HTS_Data *d;
  
  if (fp == (HTS_File *)0x0) {
    return;
  }
  if (fp->type == '\x01') {
    __ptr = (undefined8 *)fp->pointer;
    if (__ptr != (undefined8 *)0x0) {
      if ((void *)*__ptr != (void *)0x0) {
        free((void *)*__ptr);
      }
      free(__ptr);
    }
  }
  else {
    if (fp->type != '\0') {
      HTS_fclose_cold_1();
      return;
    }
    if ((FILE *)fp->pointer != (FILE *)0x0) {
      fclose((FILE *)fp->pointer);
    }
  }
  free(fp);
  return;
}

Assistant:

void HTS_fclose(HTS_File * fp)
{
   if (fp == NULL) {
      return;
   } else if (fp->type == HTS_FILE) {
      if (fp->pointer != NULL)
         fclose((FILE *) fp->pointer);
      HTS_free(fp);
      return;
   } else if (fp->type == HTS_DATA) {
      if (fp->pointer != NULL) {
         HTS_Data *d = (HTS_Data *) fp->pointer;
         if (d->data != NULL)
            HTS_free(d->data);
         HTS_free(d);
      }
      HTS_free(fp);
      return;
   }
   HTS_error(0, "HTS_fclose: Unknown file type.\n");
}